

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O2

MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_> *
deqp::egl::Image::createUnsupportedImageSource
          (MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
           *__return_storage_ptr__,string *message,GLenum format)

{
  UnsupportedImageSource *this;
  
  this = (UnsupportedImageSource *)operator_new(0x30);
  UnsupportedImageSource::UnsupportedImageSource(this,message,format);
  (__return_storage_ptr__->
  super_UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
  ).m_data.ptr = (ImageSource *)this;
  return __return_storage_ptr__;
}

Assistant:

MovePtr<ImageSource> createUnsupportedImageSource (const string& message, GLenum format)
{
	return MovePtr<ImageSource>(new UnsupportedImageSource(message, format));
}